

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat_solver.cpp
# Opt level: O3

bool __thiscall
Satyricon::SATSolver::new_clause
          (SATSolver *this,vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_> *c,
          bool learnt,ClausePtr *c_ref)

{
  pointer *ppWVar1;
  vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_> *pvVar2;
  uint uVar3;
  literal_value lVar4;
  pointer pLVar5;
  pointer plVar6;
  pointer pLVar7;
  pointer piVar8;
  iterator iVar9;
  Clause *pCVar10;
  uint uVar11;
  bool bVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  undefined7 in_register_00000011;
  size_type __new_size;
  Clause *pCVar16;
  Clause *pCVar17;
  ulong uVar18;
  literal_value lVar19;
  ulong uVar20;
  anon_union_8_2_f7e3ed0a_for_Watcher_0 local_30;
  
  *c_ref = (ClausePtr)0x0;
  if ((int)CONCAT71(in_register_00000011,learnt) == 0) {
    pLVar5 = (c->super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>).
             _M_impl.super__Vector_impl_data._M_start;
    lVar13 = (long)(c->super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)pLVar5;
    if (lVar13 == 0) {
      __new_size = 0;
    }
    else {
      uVar14 = lVar13 >> 2;
      plVar6 = (this->values).
               super__Vector_base<Satyricon::literal_value,_std::allocator<Satyricon::literal_value>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar18 = 1;
      __new_size = 0;
      lVar13 = 0;
      do {
        uVar3 = pLVar5[lVar13].value;
        lVar4 = plVar6[uVar3 >> 1];
        lVar19 = LIT_TRUE - lVar4;
        if ((uVar3 & 1) == 0) {
          lVar19 = lVar4;
        }
        if (lVar19 != LIT_FALSE) {
          uVar20 = uVar18;
          if (lVar19 == LIT_TRUE) goto LAB_001136a9;
          while (uVar20 < uVar14) {
            pLVar7 = pLVar5 + uVar20;
            if (pLVar7->value == uVar3) goto LAB_00113553;
            uVar20 = uVar20 + 1;
            if ((pLVar7->value ^ uVar3) == 1) goto LAB_001136a9;
          }
          pLVar5[__new_size].value = uVar3;
          __new_size = __new_size + 1;
        }
LAB_00113553:
        lVar13 = lVar13 + 1;
        uVar18 = uVar18 + 1;
      } while (lVar13 != uVar14 + (uVar14 == 0));
    }
    std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::resize(c,__new_size);
  }
  pLVar5 = (c->super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pLVar7 = (c->super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pLVar5 == pLVar7) {
    bVar12 = true;
  }
  else {
    if ((long)pLVar7 - (long)pLVar5 == 4) {
      bVar12 = assign(this,(Literal)pLVar5->value,(ClausePtr)0x0);
      return bVar12;
    }
    local_30.clause = Clause::allocate(c,learnt);
    *c_ref = (ClausePtr)local_30;
    if (learnt) {
      pCVar16 = (Clause *)(local_30.bits + 0xc);
      uVar3 = *(uint *)(local_30.bits + 0xc);
      uVar15 = uVar3;
      if ((ulong)(*(uint *)local_30.clause & 0xfffffffe) != 4) {
        pCVar17 = (Clause *)(local_30.bits + 0x10);
        piVar8 = (this->decision_levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar13 = (ulong)(*(uint *)local_30.clause & 0xfffffffe) * 2 + -8;
        do {
          pCVar10 = pCVar17;
          uVar11 = *(uint *)pCVar17;
          if (piVar8[*(uint *)pCVar17 >> 1] <= piVar8[uVar15 >> 1]) {
            pCVar10 = pCVar16;
            uVar11 = uVar15;
          }
          uVar15 = uVar11;
          pCVar16 = pCVar10;
          pCVar17 = (Clause *)&pCVar17->field_0x4;
          lVar13 = lVar13 + -4;
        } while (lVar13 != 0);
        uVar15 = *(uint *)pCVar16;
      }
      *(uint *)pCVar16 = uVar3;
      *(uint *)(local_30.bits + 0xc) = uVar15;
      if ((*(uint *)local_30.clause & 1) == 0) {
        __assert_fail("is_learned()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/GiuMaz[P]satyricon/include/solver_types.hpp"
                      ,0x7f,"double &Satyricon::Clause::get_activity()");
      }
      uVar14 = (ulong)(*(uint *)local_30.clause >> 1);
      *(double *)(&((Clause *)(local_30.bits + 8))->field_0x0 + uVar14 * 4) =
           (this->param).clause_activity_update +
           *(double *)(&((Clause *)(local_30.bits + 8))->field_0x0 + uVar14 * 4);
    }
    pvVar2 = (this->watch_list).
             super__Vector_base<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>,_std::allocator<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + *(uint *)(local_30.bits + 8);
    iVar9._M_current =
         (pvVar2->
         super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar9._M_current ==
        (pvVar2->
        super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>::
      _M_realloc_insert<Satyricon::SATSolver::Watcher>(pvVar2,iVar9,(Watcher *)&local_30);
    }
    else {
      ((iVar9._M_current)->field_0).clause = (ClausePtr)local_30;
      ppWVar1 = &(pvVar2->
                 super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppWVar1 = *ppWVar1 + 1;
    }
    local_30.clause = *c_ref;
    pvVar2 = (this->watch_list).
             super__Vector_base<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>,_std::allocator<std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + *(uint *)(local_30.bits + 0xc);
    iVar9._M_current =
         (pvVar2->
         super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    if (iVar9._M_current ==
        (pvVar2->
        super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>::
      _M_realloc_insert<Satyricon::SATSolver::Watcher>(pvVar2,iVar9,(Watcher *)&local_30);
    }
    else {
      ((iVar9._M_current)->field_0).clause = (ClausePtr)local_30;
      ppWVar1 = &(pvVar2->
                 super__Vector_base<Satyricon::SATSolver::Watcher,_std::allocator<Satyricon::SATSolver::Watcher>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppWVar1 = *ppWVar1 + 1;
    }
LAB_001136a9:
    bVar12 = false;
  }
  return bVar12;
}

Assistant:

bool SATSolver::new_clause(vector<Literal> &c, bool learnt, ClausePtr &c_ref) {

    c_ref = nullptr;

    if ( ! learnt ) { // simplify if possible, learned clause doesn't need this
        size_t j = 0;
        for ( size_t i = 0; i < c.size(); i++ ) {
            // discard false literal
            if ( get_asigned_value( c[i] ) == LIT_FALSE ) continue;
            // already satisfied?
            if ( get_asigned_value( c[i] ) == LIT_TRUE  )
                return false; // no conflict, new clause is a nullptr
            // look for tautology or repetition
            bool add = true;
            for ( size_t k = i+1; k < c.size(); ++k ) {
                if ( c[k] == c[i] ) { // repetition?
                    add = false;      // don't add the repeated literal
                    break;
                }
                if ( c[k] == !(c[i]) ) // tautology?
                    return false; // no conflict, new clause is a nullptr 
            }
            if ( add ) c[j++] = c[i];
        }
        c.resize(j);
    }

    // an empty clause is a conflict
    if (c.empty()) return true; // conflict, cnew clause is a nullptr

    // a clause with 1 literal is a unit, simply assign it
    if ( c.size() == 1 ) {
        // true if the assignment is in conflict, false otherwise
        // the new clause is a nullptr (don't build clause of one literal)
        return  assign( c[0], nullptr );
    }

    // build the clause
    c_ref = Clause::allocate(c,learnt);

    if ( learnt ) { 
        // pick a correct second literal to watch
        auto second = c_ref->begin()+1;
        for ( auto it = c_ref->begin()+2; it != c_ref->end(); ++it)
            if ( decision_levels[it->var()] > decision_levels[second->var()] )
                second = it;
        // swap
        Literal tmp = *second;
        *second = c_ref->at(1);
        c_ref->at(1) = tmp;

        // increase activity
        c_ref->update_activity( param.clause_activity_update );
    }

    //  add to the watch list
    watch_list[c_ref->at(0).index()].push_back(Watcher(c_ref));
    watch_list[c_ref->at(1).index()].push_back(Watcher(c_ref));

    return false; // no conflict
}